

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Error.h
# Opt level: O0

void __thiscall
Semantic::Err::UndeclaredFunction::UndeclaredFunction
          (UndeclaredFunction *this,string *funcName,int position)

{
  int position_local;
  string *funcName_local;
  UndeclaredFunction *this_local;
  
  this->super_Error = (Error)0x0;
  Error::Error(&this->super_Error);
  this->super_Error = (Error)&PTR__UndeclaredFunction_001a3268;
  std::__cxx11::string::string((string *)&this->funcName);
  std::__cxx11::string::operator=((string *)&this->funcName,(string *)funcName);
  this->position = position;
  return;
}

Assistant:

UndeclaredFunction(std::string funcName, int position) : Error() {
                this->funcName = funcName;
                this->position = position;
            }